

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

string * __thiscall
libtorrent::state_changed_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,state_changed_alert *this)

{
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  state_changed_alert *local_18;
  state_changed_alert *this_local;
  
  local_18 = this;
  this_local = (state_changed_alert *)__return_storage_ptr__;
  torrent_alert::message_abi_cxx11_(&local_58,&this->super_torrent_alert);
  ::std::operator+(&local_38,&local_58,": state changed to: ");
  ::std::operator+(__return_storage_ptr__,&local_38,
                   message::state_str[*(uint *)&(this->super_torrent_alert).field_0x2c]);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

std::string state_changed_alert::message() const
	{
#ifdef TORRENT_DISABLE_ALERT_MSG
		return {};
#else
		static char const* const state_str[] =
			{"checking (q)", "checking", "dl metadata"
			, "downloading", "finished", "seeding", "allocating"
			, "checking (r)"};

		return torrent_alert::message() + ": state changed to: "
			+ state_str[state];
#endif
	}